

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                 *this,void **vtt,int64_t globalsize)

{
  void *in_RDX;
  TPZFileEqnStorage<std::complex<long_double>_> *in_RSI;
  void **in_RDI;
  int64_t in_stack_ffffffffffffffb8;
  void **GlobalSize;
  TPZAbstractFrontMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  TPZFileEqnStorage<std::complex<long_double>_> *this_00;
  
  this_00 = in_RSI;
  TPZAbstractFrontMatrix<std::complex<long_double>_>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffd0,in_RDI,(int64_t)in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = (((TPZFront<std::complex<long_double>_> *)&in_RSI->super_TPZSavable)->super_TPZSavable).
            _vptr_TPZSavable;
  TPZFileEqnStorage<std::complex<long_double>_>::TPZFileEqnStorage(this_00);
  GlobalSize = in_RDI + 0x1b;
  TPZFrontNonSym<std::complex<long_double>_>::TPZFrontNonSym
            ((TPZFrontNonSym<std::complex<long_double>_> *)in_RSI);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x42));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x46));
  TPZFrontNonSym<std::complex<long_double>_>::Reset
            ((TPZFrontNonSym<std::complex<long_double>_> *)in_RSI,(int64_t)GlobalSize);
  TPZFileEqnStorage<std::complex<long_double>_>::Reset
            ((TPZFileEqnStorage<std::complex<long_double>_> *)(in_RDI + 4));
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[0x41] = (void *)0xffffffffffffffff;
  in_RDI[0x40] = in_RDX;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix(int64_t globalsize) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>(globalsize,globalsize)
{
	fFront.Reset(globalsize);
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=globalsize;
}